

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

dat_t * rdr_readdat(rdr_t *rdr,FILE *file,_Bool lbl)

{
  uint uVar1;
  int iVar2;
  seq_t **ppsVar3;
  undefined1 in_DL;
  FILE *in_RSI;
  seq_t *seq;
  dat_t *dat;
  uint32_t size;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  seq_t *in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar5;
  dat_t *local_8;
  
  uVar5 = CONCAT13(in_DL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  uVar4 = 1000;
  local_8 = (dat_t *)xmalloc((size_t)in_stack_ffffffffffffffd0);
  local_8->nseq = 0;
  local_8->mlen = 0;
  local_8->lbl = (_Bool)((byte)(uVar5 >> 0x18) & 1);
  ppsVar3 = (seq_t **)xmalloc((size_t)in_stack_ffffffffffffffd0);
  local_8->seq = ppsVar3;
  while ((iVar2 = feof(in_RSI), iVar2 == 0 &&
         (in_stack_ffffffffffffffd0 =
               rdr_readseq((rdr_t *)in_RSI,(FILE *)CONCAT44(uVar5,uVar4),
                           SUB81((ulong)local_8 >> 0x38,0)),
         in_stack_ffffffffffffffd0 != (seq_t *)0x0))) {
    if (local_8->nseq == uVar4) {
      uVar4 = (uint)(long)((double)uVar4 * 1.4);
      ppsVar3 = (seq_t **)
                xrealloc(in_stack_ffffffffffffffd0,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_8->seq = ppsVar3;
    }
    uVar1 = local_8->nseq;
    local_8->nseq = uVar1 + 1;
    local_8->seq[uVar1] = in_stack_ffffffffffffffd0;
    if (local_8->mlen < in_stack_ffffffffffffffd0->len) {
      in_stack_ffffffffffffffcc = in_stack_ffffffffffffffd0->len;
    }
    else {
      in_stack_ffffffffffffffcc = local_8->mlen;
    }
    local_8->mlen = in_stack_ffffffffffffffcc;
    if (local_8->nseq % 1000 == 0) {
      info("%7u sequences loaded\n",(ulong)local_8->nseq);
    }
  }
  if (local_8->nseq == 0) {
    free(local_8->seq);
    free(local_8);
    local_8 = (dat_t *)0x0;
  }
  else if (local_8->nseq < uVar4) {
    ppsVar3 = (seq_t **)
              xrealloc(in_stack_ffffffffffffffd0,
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_8->seq = ppsVar3;
  }
  return local_8;
}

Assistant:

dat_t *rdr_readdat(rdr_t *rdr, FILE *file, bool lbl) {
	// Prepare dataset
	uint32_t size = 1000;
	dat_t *dat = xmalloc(sizeof(dat_t));
	dat->nseq = 0;
	dat->mlen = 0;
	dat->lbl = lbl;
	dat->seq = xmalloc(sizeof(seq_t *) * size);
	// Load sequences
	while (!feof(file)) {
		// Read the next sequence
		seq_t *seq = rdr_readseq(rdr, file, lbl);
		if (seq == NULL)
			break;
		// Grow the buffer if needed
		if (dat->nseq == size) {
			size *= 1.4;
			dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * size);
		}
		// And store the sequence
		dat->seq[dat->nseq++] = seq;
		dat->mlen = max(dat->mlen, seq->len);
		if (dat->nseq % 1000 == 0)
			info("%7"PRIu32" sequences loaded\n", dat->nseq);
	}
	// If no sequence readed, cleanup and repport
	if (dat->nseq == 0) {
		free(dat->seq);
		free(dat);
		return NULL;
	}
	// Adjust the dataset size and return
	if (size > dat->nseq)
		dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * dat->nseq);
	return dat;
}